

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

void __thiscall vec3<unsigned_int>::normalize(vec3<unsigned_int> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar1 = (this->super_vec3_base).r;
  uVar3 = (this->super_vec3_base).g;
  fVar7 = (this->super_vec3_base).b;
  if (((((float)uVar1 != 2.1474836e+09) || (NAN((float)uVar1))) || ((float)uVar3 != 2.1474836e+09))
     || (((NAN((float)uVar3) || (fVar7 != 2.1474836e+09)) || (NAN(fVar7))))) {
    auVar10._0_8_ = (double)(float)uVar1;
    auVar10._8_8_ = (double)(float)uVar3;
    auVar10 = divpd(auVar10,_DAT_00201d50);
    auVar11._0_4_ = (float)auVar10._0_8_ + (float)auVar10._0_8_ + -1.0;
    auVar11._4_4_ = (float)auVar10._8_8_ + (float)auVar10._8_8_ + -1.0;
    auVar11._8_8_ = 0;
    fVar6 = fVar7 / 4.2949673e+09 + fVar7 / 4.2949673e+09 + -1.0;
    auVar10 = minps(_DAT_00201cf0,auVar11);
    uVar9 = CONCAT44(~-(uint)(auVar11._4_4_ < -1.0) & auVar10._4_4_,
                     ~-(uint)(auVar11._0_4_ < -1.0) & auVar10._0_4_) |
            CONCAT44(-(uint)(auVar11._4_4_ < -1.0),-(uint)(auVar11._0_4_ < -1.0)) &
            0xbf800000bf800000;
    (this->super_vec3_base).r = (float)(int)uVar9;
    (this->super_vec3_base).g = (float)(int)(uVar9 >> 0x20);
    fVar7 = 1.0;
    if (fVar6 <= 1.0) {
      fVar7 = fVar6;
    }
    (this->super_vec3_base).b =
         (float)(-(uint)(fVar6 < -1.0) & 0xbf800000 | ~-(uint)(fVar6 < -1.0) & (uint)fVar7);
    vec3_base::base_normalize(&this->super_vec3_base);
    uVar2 = (this->super_vec3_base).r;
    uVar4 = (this->super_vec3_base).g;
    fVar7 = floorf(((float)uVar2 + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
    fVar6 = floorf(((float)uVar4 + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
    fVar8 = floorf(((this->super_vec3_base).b + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
    auVar5._4_4_ = fVar6;
    auVar5._0_4_ = fVar7;
    auVar5._8_4_ = extraout_XMM0_Db;
    auVar5._12_4_ = extraout_XMM0_Db_00;
    auVar10 = minps(_DAT_00201d60,auVar5);
    (this->super_vec3_base).r = (float)(-(uint)(0.0 <= fVar7) & auVar10._0_4_);
    (this->super_vec3_base).g = (float)(-(uint)(0.0 <= fVar6) & auVar10._4_4_);
    fVar7 = 4.2949673e+09;
    if (fVar8 <= 4.2949673e+09) {
      fVar7 = fVar8;
    }
    (this->super_vec3_base).b = (float)(~-(uint)(fVar8 < 0.0) & (uint)fVar7);
  }
  return;
}

Assistant:

void normalize() {
        // Zero normals in range [-1, 1] can't be normalized
        if (gc_m[i] == r && gc_m[i] == g && gc_m[i] == b) {
            return;
        } else {
            r = (float)(r / (double)gc_s[i]) * 2.0f - 1.0f;
            g = (float)(g / (double)gc_s[i]) * 2.0f - 1.0f;
            b = (float)(b / (double)gc_s[i]) * 2.0f - 1.0f;
            clamp(-1.0f, 1.0f);
            base_normalize();
            r = (std::floor((r + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            g = (std::floor((g + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            b = (std::floor((b + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            clamp(0.0f, (float)gc_s[i]);
        }
    }